

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece.pb.cc
# Opt level: O3

void __thiscall
sentencepiece::SentencePieceText::SentencePieceText(SentencePieceText *this,SentencePieceText *from)

{
  InternalMetadata *this_00;
  void *pvVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  
  (this->super_MessageLite)._internal_metadata_.ptr_ = (void *)0x0;
  (this->_extensions_).arena_ = (Arena *)0x0;
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__SentencePieceText_0020c568;
  (this->_extensions_).flat_capacity_ = 0;
  (this->_extensions_).flat_size_ = 0;
  (this->_extensions_).map_.flat = (KeyValue *)0x0;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  *(undefined8 *)&this->_cached_size_ = 0;
  *(undefined8 *)((long)&(this->pieces_).super_RepeatedPtrFieldBase.arena_ + 4) = 0;
  (this->pieces_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->pieces_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->pieces_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<sentencepiece::SentencePieceText_SentencePiece>::TypeHandler>
            (&(this->pieces_).super_RepeatedPtrFieldBase,&(from->pieces_).super_RepeatedPtrFieldBase
            );
  this_00 = &(this->super_MessageLite)._internal_metadata_;
  pvVar1 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    if (((ulong)this_00->ptr_ & 1) == 0) {
      pbVar2 = google::protobuf::internal::InternalMetadata::
               mutable_unknown_fields_slow<std::__cxx11::string>(this_00);
    }
    else {
      pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (((ulong)this_00->ptr_ & 0xfffffffffffffffe) + 8);
    }
    std::__cxx11::string::_M_append
              ((char *)pbVar2,*(ulong *)(((ulong)pvVar1 & 0xfffffffffffffffe) + 8));
  }
  google::protobuf::internal::ExtensionSet::MergeFrom(&this->_extensions_,&from->_extensions_);
  (this->text_).tagged_ptr_.ptr_ = &google::protobuf::internal::fixed_address_empty_string;
  if (((from->_has_bits_).has_bits_[0] & 1) != 0) {
    pvVar1 = this_00->ptr_;
    if (((ulong)pvVar1 & 1) != 0) {
      pvVar1 = *(void **)((ulong)pvVar1 & 0xfffffffffffffffe);
    }
    google::protobuf::internal::ArenaStringPtr::Set
              (&this->text_,(ulong)(from->text_).tagged_ptr_.ptr_ & 0xfffffffffffffffe,pvVar1);
  }
  this->score_ = from->score_;
  return;
}

Assistant:

SentencePieceText::SentencePieceText(const SentencePieceText& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite(),
      _has_bits_(from._has_bits_),
      pieces_(from.pieces_) {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  _extensions_.MergeFrom(from._extensions_);
  text_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_text()) {
    text_.Set(::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, from._internal_text(), 
      GetArena());
  }
  score_ = from.score_;
  // @@protoc_insertion_point(copy_constructor:sentencepiece.SentencePieceText)
}